

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  pointer ppEVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  TimeInMillis TVar7;
  UnitTestImpl *pUVar8;
  TestSuite *pTVar9;
  TestPartResult *pTVar10;
  long lVar11;
  char *pcVar12;
  int test_index;
  TestResult *this_00;
  pointer ppEVar13;
  char *pcVar14;
  TestEventRepeater *pTVar15;
  byte bVar16;
  int j;
  int i_00;
  int iVar17;
  ulong uVar18;
  int i;
  uint uVar19;
  byte bVar20;
  allocator<char> local_18d;
  uint local_18c;
  TestEventRepeater *local_188;
  uint local_180;
  int local_17c;
  vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *local_178;
  ulong local_170;
  char kNoTestLinkedWarning [35];
  char kNoTestLinkedMessage [50];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  char kNoTestLinkedFatal [69];
  
  bVar20 = 0;
  bVar4 = GTestIsInitialized();
  bVar16 = 1;
  if (g_help_flag == '\0') {
    PostFlagParsingInit(this);
    iVar6 = total_test_count(this);
    cVar3 = FLAGS_gtest_fail_if_no_test_linked;
    if (iVar6 == 0) {
      builtin_strncpy(kNoTestLinkedMessage,"This test program does NOT link in any test case.",0x32)
      ;
      pcVar12 = "This is INVALID. Please make sure to link in at least one test case.";
      pcVar14 = kNoTestLinkedFatal;
      for (lVar11 = 0x45; lVar11 != 0; lVar11 = lVar11 + -1) {
        *pcVar14 = *pcVar12;
        pcVar12 = pcVar12 + (ulong)bVar20 * -2 + 1;
        pcVar14 = pcVar14 + (ulong)bVar20 * -2 + 1;
      }
      builtin_strncpy(kNoTestLinkedWarning,"Please make sure this is intended.",0x23);
      pcVar12 = kNoTestLinkedWarning;
      if (FLAGS_gtest_fail_if_no_test_linked != '\0') {
        pcVar12 = kNoTestLinkedFatal;
      }
      ColoredPrintf(kRed,"%s %s\n",kNoTestLinkedMessage,pcVar12);
      if (cVar3 != '\0') {
        bVar16 = 0;
        goto LAB_002154e9;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,kNoTestLinkedMessage,&local_18d);
      std::operator+(&local_b8,&local_d8,' ');
      std::operator+(&local_98,&local_b8,kNoTestLinkedWarning);
      std::operator+(&local_f8,&local_98,'\n');
      AppendToTestWarningsOutputFile(&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    WriteToShardStatusFileIfNeeded();
    pIVar1 = (this->internal_run_death_test_flag_)._M_t.
             super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>.
             _M_head_impl;
    bVar5 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                        pIVar1 != (InternalRunDeathTestFlag *)0x0);
    local_17c = FilterTests(this,(uint)!bVar5);
    if (FLAGS_gtest_list_tests == '\x01') {
      ListTestsMatchingFilter(this);
    }
    else {
      iVar6 = GetRandomSeedFromFlag(FLAGS_gtest_random_seed);
      this->random_seed_ = iVar6;
      pTVar15 = (this->listeners_).repeater_;
      TVar7 = GetTimeInMillis();
      this->start_timestamp_ = TVar7;
      (*(pTVar15->super_TestEventListener)._vptr_TestEventListener[2])(pTVar15,this->parent_);
      bVar16 = FLAGS_gtest_recreate_environments_when_repeating;
      local_170 = 1;
      if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
        local_170 = (ulong)FLAGS_gtest_repeat;
      }
      iVar6 = (int)local_170;
      local_178 = &this->environments_;
      local_180 = iVar6 - 1;
      uVar18 = 0;
      uVar19 = 0;
      local_188 = pTVar15;
LAB_002150e8:
      pTVar15 = local_188;
      if (uVar19 != (uint)local_170 || (int)(uint)local_170 < 0) {
        ClearNonAdHocTestResult(this);
        kNoTestLinkedMessage._0_8_ = std::chrono::_V2::steady_clock::now();
        if (0 < local_17c) {
          if (FLAGS_gtest_shuffle == '\x01') {
            (this->random_).state_ = this->random_seed_;
            ShuffleTests(this);
          }
          (*(pTVar15->super_TestEventListener)._vptr_TestEventListener[3])
                    (pTVar15,this->parent_,(ulong)uVar19);
          if (uVar19 == 0 || (iVar6 < 0 || (bVar16 & 1) != 0)) {
            (*(pTVar15->super_TestEventListener)._vptr_TestEventListener[4])(pTVar15,this->parent_);
            ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                      (local_178,SetUpEnvironment);
            (*(pTVar15->super_TestEventListener)._vptr_TestEventListener[5])(pTVar15,this->parent_);
          }
          bVar5 = Test::IsSkipped();
          local_18c = (uint)uVar18;
          if (bVar5) {
            pUVar8 = GetUnitTestImpl();
            if (pUVar8->current_test_info_ == (TestInfo *)0x0) {
              if (pUVar8->current_test_suite_ == (TestSuite *)0x0) {
                this_00 = &pUVar8->ad_hoc_test_result_;
              }
              else {
                this_00 = &pUVar8->current_test_suite_->ad_hoc_test_result_;
              }
            }
            else {
              this_00 = &pUVar8->current_test_info_->result_;
            }
            for (iVar17 = 0;
                iVar17 < (int)(((long)(this_00->test_part_results_).
                                      super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this_00->test_part_results_).
                                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x70);
                iVar17 = iVar17 + 1) {
              pTVar10 = TestResult::GetTestPartResult(this_00,iVar17);
              if (pTVar10->type_ == kSkip) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)kNoTestLinkedFatal,(pTVar10->message_)._M_dataplus._M_p,
                           (allocator<char> *)kNoTestLinkedWarning);
                puts((char *)kNoTestLinkedFatal._0_8_);
                std::__cxx11::string::~string((string *)kNoTestLinkedFatal);
              }
            }
            fflush(_stdout);
          }
          else {
            bVar5 = Test::HasFatalFailure();
            if (bVar5) {
              bVar5 = Test::HasFatalFailure();
              if (bVar5) {
                for (iVar17 = 0;
                    iVar17 < (int)((ulong)((long)(this->test_suites_).
                                                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->test_suites_).
                                                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
                    iVar17 = iVar17 + 1) {
                  pTVar9 = GetMutableSuiteCase(this,iVar17);
                  TestSuite::Skip(pTVar9);
                }
              }
            }
            else {
              iVar17 = 1;
              for (i_00 = 0;
                  i_00 < (int)((ulong)((long)(this->test_suites_).
                                             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->test_suites_).
                                            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
                  i_00 = i_00 + 1) {
                pTVar9 = GetMutableSuiteCase(this,i_00);
                TestSuite::Run(pTVar9);
                if (FLAGS_gtest_fail_fast == '\x01') {
                  pTVar9 = GetMutableSuiteCase(this,i_00);
                  bVar5 = TestSuite::Failed(pTVar9);
                  if (bVar5) goto LAB_0021527f;
                }
                iVar17 = iVar17 + 1;
              }
            }
          }
          goto LAB_00215325;
        }
        (*(pTVar15->super_TestEventListener)._vptr_TestEventListener[3])
                  (pTVar15,this->parent_,(ulong)uVar19);
        goto LAB_00215388;
      }
      (*(local_188->super_TestEventListener)._vptr_TestEventListener[0x11])(local_188,this->parent_)
      ;
      ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                (local_178,Delete<testing::Environment>);
      ppEVar2 = (this->environments_).
                super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->environments_).
          super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppEVar2) {
        (this->environments_).
        super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppEVar2;
      }
      bVar5 = ShouldWarnIfNoTestsMatchFilter(this);
      if (bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)kNoTestLinkedWarning,"filter \"",(allocator<char> *)&local_f8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       kNoTestLinkedMessage,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       kNoTestLinkedWarning,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       FLAGS_gtest_filter_abi_cxx11_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       kNoTestLinkedFatal,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       kNoTestLinkedMessage,"\" did not match any test; no tests were run\n");
        std::__cxx11::string::~string((string *)kNoTestLinkedMessage);
        std::__cxx11::string::~string((string *)kNoTestLinkedWarning);
        ColoredPrintf(kRed,"WARNING: %s",kNoTestLinkedFatal._0_8_);
        AppendToTestWarningsOutputFile((string *)kNoTestLinkedFatal);
        std::__cxx11::string::~string((string *)kNoTestLinkedFatal);
      }
      if (!bVar4) {
        ColoredPrintf(kRed,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      bVar16 = (byte)uVar18 ^ 1;
    }
  }
LAB_002154e9:
  return (bool)(bVar16 & 1);
LAB_0021527f:
  for (; iVar17 < (int)((ulong)((long)(this->test_suites_).
                                      super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->test_suites_).
                                     super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar17 = iVar17 + 1) {
    pTVar9 = GetMutableSuiteCase(this,iVar17);
    TestSuite::Skip(pTVar9);
  }
LAB_00215325:
  uVar18 = (ulong)local_18c;
  pTVar15 = local_188;
  if (uVar19 == local_180 || (iVar6 < 0 || (bVar16 & 1) != 0)) {
    (*(local_188->super_TestEventListener)._vptr_TestEventListener[0xe])(local_188,this->parent_);
    ppEVar2 = (this->environments_).
              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (ppEVar13 = (this->environments_).
                    super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pTVar15 = local_188,
        ppEVar13 != ppEVar2; ppEVar13 = ppEVar13 + -1) {
      (**(code **)(*(long *)ppEVar13[-1] + 0x18))();
    }
    (*(local_188->super_TestEventListener)._vptr_TestEventListener[0xf])(local_188,this->parent_);
    uVar18 = (ulong)local_18c;
  }
LAB_00215388:
  TVar7 = Timer::Elapsed((Timer *)kNoTestLinkedMessage);
  this->elapsed_time_ = TVar7;
  (*(pTVar15->super_TestEventListener)._vptr_TestEventListener[0x10])
            (pTVar15,this->parent_,(ulong)uVar19);
  bVar5 = Passed(this);
  UnshuffleTests(this);
  if (FLAGS_gtest_shuffle == '\x01') {
    iVar17 = GetNextRandomSeed(this->random_seed_);
    this->random_seed_ = iVar17;
  }
  uVar18 = CONCAT71((int7)(uVar18 >> 8),(byte)uVar18 | !bVar5);
  uVar19 = uVar19 + 1;
  goto LAB_002150e8;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag) return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Handle the case where the program has no tests linked.
  // Sometimes this is a programmer mistake, but sometimes it is intended.
  if (total_test_count() == 0) {
    constexpr char kNoTestLinkedMessage[] =
        "This test program does NOT link in any test case.";
    constexpr char kNoTestLinkedFatal[] =
        "This is INVALID. Please make sure to link in at least one test case.";
    constexpr char kNoTestLinkedWarning[] =
        "Please make sure this is intended.";
    const bool fail_if_no_test_linked = GTEST_FLAG_GET(fail_if_no_test_linked);
    ColoredPrintf(
        GTestColor::kRed, "%s %s\n", kNoTestLinkedMessage,
        fail_if_no_test_linked ? kNoTestLinkedFatal : kNoTestLinkedWarning);
    if (fail_if_no_test_linked) {
      return false;
    }
#if GTEST_HAS_FILE_SYSTEM
    AppendToTestWarningsOutputFile(std::string(kNoTestLinkedMessage) + ' ' +
                                   kNoTestLinkedWarning + '\n');
#endif  // GTEST_HAS_FILE_SYSTEM
  }

#if GTEST_HAS_FILE_SYSTEM
  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();
#endif  // GTEST_HAS_FILE_SYSTEM

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#ifdef GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_ != nullptr);
#if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
#endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run =
      FilterTests(should_shard ? HONOR_SHARDING_PROTOCOL
                               : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG_GET(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GetRandomSeedFromFlag(GTEST_FLAG_GET(random_seed));

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG_GET(repeat);

  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;

  // Should test environments be set up and torn down for each repeat, or only
  // set up on the first and torn down on the last iteration? If there is no
  // "last" iteration because the tests will repeat forever, always recreate the
  // environments to avoid leaks in case one of the environments is using
  // resources that are external to this process. Without this check there would
  // be no way to clean up those external resources automatically.
  const bool recreate_environments_when_repeating =
      GTEST_FLAG_GET(recreate_environments_when_repeating) ||
      gtest_repeat_forever;

  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    Timer timer;

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG_GET(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand. If test environments aren't
      // recreated for each iteration, only do so on the first iteration.
      if (i == 0 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsSetUpStart(*parent_);
        ForEach(environments_, SetUpEnvironment);
        repeater->OnEnvironmentsSetUpEnd(*parent_);
      }

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG_GET(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      } else if (Test::HasFatalFailure()) {
        // If there was a fatal failure during the global setup then we know we
        // aren't going to run any tests. Explicitly mark all of the tests as
        // skipped to make this obvious in the output.
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Skip();
        }
      }

      // Tears down all environments in reverse order afterwards. If test
      // environments aren't recreated for each iteration, only do so on the
      // last iteration.
      if (i == repeat - 1 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsTearDownStart(*parent_);
        std::for_each(environments_.rbegin(), environments_.rend(),
                      TearDownEnvironment);
        repeater->OnEnvironmentsTearDownEnd(*parent_);
      }
    }

    elapsed_time_ = timer.Elapsed();

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG_GET(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);
  // Destroy environments in normal code, not in static teardown.
  bool delete_environment_on_teardown = true;
  if (delete_environment_on_teardown) {
    ForEach(environments_, internal::Delete<Environment>);
    environments_.clear();
  }

  // Try to warn the user if no tests matched the test filter.
  if (ShouldWarnIfNoTestsMatchFilter()) {
    const std::string filter_warning =
        std::string("filter \"") + GTEST_FLAG_GET(filter) +
        "\" did not match any test; no tests were run\n";
    ColoredPrintf(GTestColor::kRed, "WARNING: %s", filter_warning.c_str());
#if GTEST_HAS_FILE_SYSTEM
    AppendToTestWarningsOutputFile(filter_warning);
#endif  // GTEST_HAS_FILE_SYSTEM
  }

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
  }

  return !failed;
}